

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::UnitTestImpl::RecordProperty(UnitTestImpl *this,TestProperty *test_property)

{
  TestResult *this_00;
  undefined1 local_38 [8];
  string xml_element;
  
  local_38 = (undefined1  [8])&xml_element._M_string_length;
  xml_element._M_dataplus._M_p = (pointer)0x0;
  xml_element._M_string_length._0_1_ = 0;
  if (this->current_test_info_ == (TestInfo *)0x0) {
    if (this->current_test_case_ == (TestCase *)0x0) {
      std::__cxx11::string::assign(local_38);
      this_00 = &this->ad_hoc_test_result_;
    }
    else {
      std::__cxx11::string::assign(local_38);
      this_00 = &this->current_test_case_->ad_hoc_test_result_;
    }
  }
  else {
    std::__cxx11::string::assign(local_38);
    this_00 = &this->current_test_info_->result_;
  }
  TestResult::RecordProperty(this_00,(string *)local_38,test_property);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void UnitTestImpl::RecordProperty(const TestProperty& test_property) {
  std::string xml_element;
  TestResult* test_result;  // TestResult appropriate for property recording.

  if (current_test_info_ != NULL) {
    xml_element = "testcase";
    test_result = &(current_test_info_->result_);
  } else if (current_test_case_ != NULL) {
    xml_element = "testsuite";
    test_result = &(current_test_case_->ad_hoc_test_result_);
  } else {
    xml_element = "testsuites";
    test_result = &ad_hoc_test_result_;
  }
  test_result->RecordProperty(xml_element, test_property);
}